

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.h
# Opt level: O0

void __thiscall MeCab::Param::~Param(Param *this)

{
  Param *in_RDI;
  
  ~Param(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~Param() {}